

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

char * tonk_result_to_string(TonkResult result)

{
  TonkResult result_local;
  char *local_8;
  
  switch(result) {
  case Tonk_Success:
    local_8 = "Tonk_Success";
    break;
  case Tonk_InvalidInput:
    local_8 = "Tonk_InvalidInput";
    break;
  case Tonk_Error:
    local_8 = "Tonk_Error";
    break;
  case Tonk_HostnameLookup:
    local_8 = "Tonk_HostnameLookup";
    break;
  case Tonk_InvalidChannel:
    local_8 = "Tonk_InvalidChannel";
    break;
  case Tonk_MessageTooLarge:
    local_8 = "Tonk_MessageTooLarge";
    break;
  case Tonk_NetworkFailed:
    local_8 = "Tonk_NetworkFailed";
    break;
  case Tonk_PRNGFailed:
    local_8 = "Tonk_PRNGFailed";
    break;
  case Tonk_FECFailed:
    local_8 = "Tonk_FECFailed";
    break;
  case Tonk_InvalidData:
    local_8 = "Tonk_InvalidData";
    break;
  case Tonk_ConnectionRejected:
    local_8 = "Tonk_ConnectionRejected";
    break;
  case Tonk_ConnectionTimeout:
    local_8 = "Tonk_ConnectionTimeout";
    break;
  case Tonk_AppRequest:
    local_8 = "Tonk_AppRequest";
    break;
  case Tonk_RemoteRequest:
    local_8 = "Tonk_RemoteRequest";
    break;
  case Tonk_RemoteTimeout:
    local_8 = "Tonk_RemoteTimeout";
    break;
  case Tonk_BogonData:
    local_8 = "Tonk_BogonData";
    break;
  case Tonk_OOM:
    local_8 = "Tonk_OOM";
    break;
  case Tonk_DLL_Not_Found:
    local_8 = "Tonk_DLL_Not_Found";
    break;
  default:
    local_8 = "Unknown";
  }
  return local_8;
}

Assistant:

TONK_EXPORT const char* tonk_result_to_string(TonkResult result)
{
    static_assert(TonkResult_Count == 18, "Update this too");
    switch (result)
    {
    case Tonk_Success: return "Tonk_Success";
    case Tonk_InvalidInput: return "Tonk_InvalidInput";
    case Tonk_Error: return "Tonk_Error";
    case Tonk_HostnameLookup: return "Tonk_HostnameLookup";
    case Tonk_InvalidChannel: return "Tonk_InvalidChannel";
    case Tonk_MessageTooLarge: return "Tonk_MessageTooLarge";
    case Tonk_NetworkFailed: return "Tonk_NetworkFailed";
    case Tonk_PRNGFailed: return "Tonk_PRNGFailed";
    case Tonk_FECFailed: return "Tonk_FECFailed";
    case Tonk_InvalidData: return "Tonk_InvalidData";
    case Tonk_ConnectionRejected: return "Tonk_ConnectionRejected";
    case Tonk_ConnectionTimeout: return "Tonk_ConnectionTimeout";
    case Tonk_AppRequest: return "Tonk_AppRequest";
    case Tonk_RemoteRequest: return "Tonk_RemoteRequest";
    case Tonk_RemoteTimeout: return "Tonk_RemoteTimeout";
    case Tonk_BogonData: return "Tonk_BogonData";
    case Tonk_OOM: return "Tonk_OOM";
    case Tonk_DLL_Not_Found: return "Tonk_DLL_Not_Found";
    default: break;
    }
    return "Unknown";
}